

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  array<vec<4UL,_double>,_3UL> pts;
  size_t sVar2;
  long lVar3;
  size_t __n;
  void *__buf;
  vec<4UL,_double> *pvVar4;
  mat4 *pmVar5;
  array<vec<4UL,_double>,_3UL> *paVar6;
  mat4 *pmVar7;
  double *pdVar8;
  int j;
  size_t i;
  ulong uVar9;
  byte bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 in_stack_fffffffffffffb80 [24];
  string local_468;
  vec4f local_448;
  DepthBuffer zbuffer;
  TGAImage image;
  string local_3d8;
  array<vec<4UL,_double>,_3UL> screen_coords;
  Model model;
  GouraudShader shader;
  
  bVar10 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"obj/african_head.obj",(allocator<char> *)&shader);
  Model::Model(&model,&local_3d8,true,false,false);
  std::__cxx11::string::~string((string *)&local_3d8);
  vec<3UL,_double>::normalize(&light_dir);
  TGAImage::TGAImage(&image,800,800,3);
  DepthBuffer::DepthBuffer(&zbuffer,800,800);
  pmVar5 = &shader.super_IShader.uniform_ModelView;
  memset(pmVar5,0,0x180);
  shader.super_IShader._vptr_IShader = (_func_int **)&PTR__IShader_00109d40;
  shader.varying_tri.rows[0].x = 0.0;
  shader.varying_tri.rows[0].y = 0.0;
  shader.varying_tri.rows[0].z = 0.0;
  shader.varying_tri.rows[1].x = 0.0;
  shader.varying_tri.rows[1].y = 0.0;
  shader.varying_tri.rows[1].z = 0.0;
  shader.varying_tri.rows[2].x = 0.0;
  shader.varying_tri.rows[2].y = 0.0;
  shader.varying_tri.rows[2].z = 0.0;
  shader.varying_ity.x = 0.0;
  shader.varying_ity.y = 0.0;
  shader.varying_ity.z = 0.0;
  shader.uniform_light_dir.x = 0.0;
  shader.uniform_light_dir.y = 0.0;
  shader.uniform_light_dir.z = 0.0;
  dVar11 = eye.x;
  dVar12 = eye.y;
  dVar13 = eye.z;
  dVar14 = center.x;
  dVar15 = center.y;
  dVar16 = center.z;
  dVar17 = up.x;
  dVar18 = up.y;
  dVar19 = up.z;
  lookat(stack0xfffffffffffffbf0,(vec3f)image._8_24_,stack0xfffffffffffffc20);
  paVar6 = &screen_coords;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pmVar5->rows[0].data[0] = paVar6->_M_elems[0].data[0];
    paVar6 = (array<vec<4UL,_double>,_3UL> *)((long)paVar6 + ((ulong)bVar10 * -2 + 1) * 8);
    pmVar5 = (mat4 *)((long)pmVar5 + (ulong)bVar10 * -0x10 + 8);
  }
  viewport((mat4 *)&screen_coords,100,100,600,600);
  paVar6 = &screen_coords;
  pmVar5 = &shader.super_IShader.uniform_Viewport;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pmVar5->rows[0].data[0] = paVar6->_M_elems[0].data[0];
    paVar6 = (array<vec<4UL,_double>,_3UL> *)((long)paVar6 + ((ulong)bVar10 * -2 + 1) * 8);
    pmVar5 = (mat4 *)((long)pmVar5 + (ulong)bVar10 * -0x10 + 8);
  }
  operator-((vec<3UL,_double> *)&local_448,&eye,&center);
  dVar1 = vec<3UL,_double>::norm((vec<3UL,_double> *)&local_448);
  projection((mat4 *)&screen_coords,-1.0 / dVar1);
  pmVar5 = (mat4 *)&screen_coords;
  pmVar7 = &shader.super_IShader.uniform_Projection;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pmVar7->rows[0].data[0] = pmVar5->rows[0].data[0];
    pmVar5 = (mat4 *)((long)pmVar5 + ((ulong)bVar10 * -2 + 1) * 8);
    pmVar7 = (mat4 *)((long)pmVar7 + (ulong)bVar10 * -0x10 + 8);
  }
  shader.uniform_light_dir.x = light_dir.x;
  shader.uniform_light_dir.y = light_dir.y;
  shader.uniform_light_dir.z = light_dir.z;
  uVar9 = 0;
  while( true ) {
    sVar2 = Model::nfaces(&model);
    if (sVar2 <= uVar9) break;
    screen_coords._M_elems[2].data[2] = 0.0;
    screen_coords._M_elems[2].data[3] = 0.0;
    screen_coords._M_elems[2].data[0] = 0.0;
    screen_coords._M_elems[2].data[1] = 0.0;
    screen_coords._M_elems[1].data[2] = 0.0;
    screen_coords._M_elems[1].data[3] = 0.0;
    screen_coords._M_elems[1].data[0] = 0.0;
    screen_coords._M_elems[1].data[1] = 0.0;
    screen_coords._M_elems[0].data[2] = 0.0;
    screen_coords._M_elems[0].data[3] = 0.0;
    screen_coords._M_elems[0].data[0] = 0.0;
    screen_coords._M_elems[0].data[1] = 0.0;
    pvVar4 = screen_coords._M_elems;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      GouraudShader::vertex(&local_448,&shader,&model,(int)uVar9,(int)lVar3);
      ((vec<4UL,_double> *)pvVar4->data)->data[2] = local_448.data[2];
      ((vec<4UL,_double> *)pvVar4->data)->data[3] = local_448.data[3];
      ((vec<4UL,_double> *)pvVar4->data)->data[0] = local_448.data[0];
      ((vec<4UL,_double> *)pvVar4->data)->data[1] = local_448.data[1];
      pvVar4 = pvVar4 + 1;
    }
    paVar6 = &screen_coords;
    pdVar8 = (double *)&stack0xfffffffffffffb38;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar8 = paVar6->_M_elems[0].data[0];
      paVar6 = (array<vec<4UL,_double>,_3UL> *)((long)paVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      pdVar8 = pdVar8 + (ulong)bVar10 * -2 + 1;
    }
    pts._M_elems[0].data[1] = dVar12;
    pts._M_elems[0].data[0] = dVar11;
    pts._M_elems[0].data[2] = dVar13;
    pts._M_elems[0].data[3] = dVar14;
    pts._M_elems[1].data[0] = dVar15;
    pts._M_elems[1].data[1] = dVar16;
    pts._M_elems[1].data[2] = dVar17;
    pts._M_elems[1].data[3] = dVar18;
    pts._M_elems[2].data[0] = dVar19;
    pts._M_elems[2].data[1] = (double)in_stack_fffffffffffffb80._0_8_;
    pts._M_elems[2].data[2] = (double)in_stack_fffffffffffffb80._8_8_;
    pts._M_elems[2].data[3] = (double)in_stack_fffffffffffffb80._16_8_;
    triangle(&model,pts,&shader.super_IShader,&image,&zbuffer);
    uVar9 = uVar9 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"output.tga",(allocator<char> *)&screen_coords);
  __n = 1;
  TGAImage::write_tga_file(&image,&local_468,true,true);
  std::__cxx11::string::~string((string *)&local_468);
  DepthBuffer::write(&zbuffer,0x106050,__buf,__n);
  IShader::~IShader(&shader.super_IShader);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&zbuffer.data.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&image);
  Model::~Model(&model);
  return 0;
}

Assistant:

int main()
{
    Model model{"obj/african_head.obj", true, false, false};

    light_dir.normalize();

    TGAImage image(width, height, TGAImage::RGB);
    DepthBuffer zbuffer(width, height);

    GouraudShader shader;
    shader.uniform_ModelView = lookat(eye, center, up);
    shader.uniform_Viewport = viewport(width / 8, height / 8, width * 3 / 4, height * 3 / 4);
    shader.uniform_Projection = projection(-1. / (eye - center).norm());
    shader.uniform_light_dir = light_dir;
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec4f, 3> screen_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = shader.vertex(model, i, j);
        }
        triangle(model, screen_coords, shader, image, zbuffer);
    }

    // image.flip_vertically();  // to place the origin in the bottom left corner of the image
    // zbuffer.flip_vertically();
    image.write_tga_file("output.tga");
    zbuffer.write("zbuffer.tga");

    return 0;
}